

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_set_socket_functions.c
# Opt level: O0

int default_asetsockopt(ares_socket_t sock,ares_socket_opt_t opt,void *val,ares_socklen_t val_size,
                       void *user_data)

{
  ares_bool_t aVar1;
  size_t len;
  int *piVar2;
  ares_bool_t *pval;
  void *pvStack_30;
  int oval;
  void *user_data_local;
  void *pvStack_20;
  ares_socklen_t val_size_local;
  void *val_local;
  ares_socket_t local_10;
  ares_socket_opt_t opt_local;
  ares_socket_t sock_local;
  
  pvStack_30 = user_data;
  user_data_local._4_4_ = val_size;
  pvStack_20 = val;
  val_local._4_4_ = opt;
  local_10 = sock;
  switch(opt) {
  case ARES_SOCKET_OPT_SENDBUF_SIZE:
    if (val_size == 4) {
      opt_local = setsockopt(sock,1,7,val,4);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      opt_local = ~ARES_SOCKET_OPT_SENDBUF_SIZE;
    }
    break;
  case ARES_SOCKET_OPT_RECVBUF_SIZE:
    if (val_size == 4) {
      opt_local = setsockopt(sock,1,8,val,4);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      opt_local = ~ARES_SOCKET_OPT_SENDBUF_SIZE;
    }
    break;
  case ARES_SOCKET_OPT_BIND_DEVICE:
    len = ares_strnlen((char *)val,(ulong)val_size);
    aVar1 = ares_str_isprint((char *)val,len);
    if (aVar1 == ARES_FALSE) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      opt_local = ~ARES_SOCKET_OPT_SENDBUF_SIZE;
    }
    else {
      opt_local = setsockopt(local_10,1,0x19,pvStack_20,user_data_local._4_4_);
    }
    break;
  case ARES_SOCKET_OPT_TCP_FASTOPEN:
    if (val_size == 4) {
      pval._4_4_ = *val;
      opt_local = setsockopt(sock,6,0x1e,(void *)((long)&pval + 4),4);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      opt_local = ~ARES_SOCKET_OPT_SENDBUF_SIZE;
    }
    break;
  default:
    piVar2 = __errno_location();
    *piVar2 = 0x26;
    opt_local = ~ARES_SOCKET_OPT_SENDBUF_SIZE;
  }
  return opt_local;
}

Assistant:

static int default_asetsockopt(ares_socket_t sock, ares_socket_opt_t opt,
                               const void *val, ares_socklen_t val_size,
                               void *user_data)
{
  switch (opt) {
    case ARES_SOCKET_OPT_SENDBUF_SIZE:
      if (val_size != sizeof(int)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
      return setsockopt(sock, SOL_SOCKET, SO_SNDBUF, val, val_size);

    case ARES_SOCKET_OPT_RECVBUF_SIZE:
      if (val_size != sizeof(int)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
      return setsockopt(sock, SOL_SOCKET, SO_RCVBUF, val, val_size);

    case ARES_SOCKET_OPT_BIND_DEVICE:
      /* Count the number of characters before NULL terminator then
       * validate those are all printable */
      if (!ares_str_isprint(val, ares_strnlen(val, (size_t)val_size))) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
#ifdef SO_BINDTODEVICE
      return setsockopt(sock, SOL_SOCKET, SO_BINDTODEVICE, val, val_size);
#else
      SET_SOCKERRNO(ENOSYS);
      return -1;
#endif

    case ARES_SOCKET_OPT_TCP_FASTOPEN:
      if (val_size != sizeof(ares_bool_t)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
#if defined(TFO_CLIENT_SOCKOPT)
      {
        int                oval;
        const ares_bool_t *pval = val;
        oval                    = (int)*pval;
        return setsockopt(sock, IPPROTO_TCP, TFO_CLIENT_SOCKOPT, (void *)&oval,
                          sizeof(oval));
      }
#elif TFO_SUPPORTED
      return 0;
#else
      SET_SOCKERRNO(ENOSYS);
      return -1;
#endif
  }

  (void)user_data;
  SET_SOCKERRNO(ENOSYS);
  return -1;
}